

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int get_versionless(FileName *varray,char *file,char *dir)

{
  char *local_38;
  char *lf_cp2;
  char *lf_cp1;
  char *dir_local;
  char *file_local;
  FileName *varray_local;
  
  file_local = varray->name;
  if (varray->version_no != 0xffffffff) {
    for (; *(int *)(file_local + 0x1000) != -1; file_local = file_local + 0x1004) {
      local_38 = dir;
      lf_cp2 = dir;
      if (*(int *)(file_local + 0x1000) == 0) {
        for (; *local_38 != '\0'; local_38 = local_38 + 1) {
          if (*local_38 == '/') {
            lf_cp2 = local_38;
          }
        }
        if (lf_cp2 == local_38 + -1) {
          if (lf_cp2 == dir) {
            strcpy(file,"/");
            strcat(file,file_local);
          }
          else {
            strcpy(file,dir);
            strcat(file,file_local);
          }
        }
        else {
          strcpy(file,dir);
          strcat(file,"/");
          strcat(file,file_local);
        }
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int get_versionless(FileName *varray, char *file, char *dir)
{
#ifdef DOS
  return (0);
#endif /* DOS */
  if (NoFileP(varray)) return (0);

  while (varray->version_no != LASTVERSIONARRAY) {
    if (varray->version_no == 0) {
      ConcDirAndName(dir, varray->name, file);
      return (1);
    } else
      varray++;
  }
  return (0);
}